

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_0::TestIgnorer::IsIgnored
          (TestIgnorer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer pSVar1;
  ushort *puVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  undefined **ppuVar6;
  size_t i;
  ulong uVar7;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string name;
  AlphaNum local_90;
  AlphaNum local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,anon_var_dwarf_651463 + 5,(allocator<char> *)&local_90);
  lVar5 = 0x18;
  for (uVar7 = 0;
      pSVar1 = (parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(parent_fields->
                             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x60);
      uVar7 = uVar7 + 1) {
    puVar2 = *(ushort **)(*(long *)((long)&pSVar1->message1 + lVar5) + 8);
    local_90.piece_._M_len = (size_t)*puVar2;
    local_90.piece_._M_str = (char *)(~local_90.piece_._M_len + (long)puVar2);
    local_60.piece_ = absl::lts_20250127::NullSafeStringView(".");
    absl::lts_20250127::StrAppend(&name,&local_90,&local_60);
    lVar5 = lVar5 + 0x60;
  }
  puVar2 = (ushort *)(field->all_names_).payload_;
  local_90.piece_._M_len = (size_t)*puVar2;
  local_90.piece_._M_str = (char *)((long)puVar2 + ~local_90.piece_._M_len);
  absl::lts_20250127::StrAppend(&name,&local_90);
  ppuVar6 = &PTR_anon_var_dwarf_2032ef9_0166f1f8;
  uVar7 = 0;
  do {
    uVar4 = uVar7;
    if (uVar4 == 2) break;
    __y._M_str = *ppuVar6;
    __y._M_len = (size_t)ppuVar6[-1];
    __x._M_str = name._M_dataplus._M_p;
    __x._M_len = name._M_string_length;
    bVar3 = std::operator==(__x,__y);
    ppuVar6 = ppuVar6 + 2;
    uVar7 = uVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::~string((string *)&name);
  return uVar4 < 2;
}

Assistant:

bool IsIgnored(const Message& message1, const Message& message2,
                 const FieldDescriptor* field,
                 const std::vector<util::MessageDifferencer::SpecificField>&
                     parent_fields) override {
    std::string name = "";
    for (size_t i = 0; i < parent_fields.size(); ++i) {
      absl::StrAppend(&name, parent_fields[i].field->name(), ".");
    }
    absl::StrAppend(&name, field->name());
    for (size_t i = 0; i < ABSL_ARRAYSIZE(kIgnoredFields); ++i) {
      if (name == kIgnoredFields[i]) {
        return true;
      }
    }
    return false;
  }